

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::
PlainSkipTemplatedDefines<duckdb::TemplatedParquetValueConversion<unsigned_long>,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values)

{
  idx_t iVar1;
  ulong uVar2;
  data_ptr_t pdVar3;
  uint64_t uVar4;
  
  uVar2 = plain_data->len;
  if (uVar2 < num_values * 8) {
    PlainSkipTemplatedInternal<duckdb::TemplatedParquetValueConversion<unsigned_long>,true,true>
              (this,plain_data,defines,num_values,0);
    return;
  }
  if (num_values != 0) {
    pdVar3 = plain_data->ptr;
    iVar1 = this->column_schema->max_define;
    uVar4 = 0;
    do {
      if (iVar1 == defines[uVar4]) {
        uVar2 = uVar2 - 8;
        plain_data->len = uVar2;
        pdVar3 = pdVar3 + 8;
        plain_data->ptr = pdVar3;
      }
      uVar4 = uVar4 + 1;
    } while (num_values != uVar4);
  }
  return;
}

Assistant:

static bool PlainAvailable(const ByteBuffer &plain_data, const idx_t count) {
		return plain_data.check_available(count * sizeof(VALUE_TYPE));
	}